

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

bool slang::caseXWildcardEqual(SVInt *lhs,SVInt *rhs)

{
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 *paVar1;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 *paVar2;
  bool bVar3;
  uint uVar4;
  SVInt *pSVar5;
  SVInt *pSVar6;
  bool bVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  SVInt local_30;
  
  bVar7 = (lhs->super_SVIntStorage).unknownFlag;
  if ((bVar7 == false) && ((rhs->super_SVIntStorage).unknownFlag == false)) {
    bVar7 = exactlyEqual(lhs,rhs);
    return bVar7;
  }
  uVar4 = (lhs->super_SVIntStorage).bitWidth;
  uVar8 = (rhs->super_SVIntStorage).bitWidth;
  if (uVar4 == uVar8) {
    uVar8 = uVar4 + 0x3f >> 6;
    pSVar5 = (SVInt *)(lhs->super_SVIntStorage).field_0.val;
    bVar3 = (rhs->super_SVIntStorage).unknownFlag;
    if (bVar7 != false) {
      lhs = pSVar5;
    }
    pSVar6 = (SVInt *)(rhs->super_SVIntStorage).field_0.val;
    if ((bVar3 & 1U) != 0) {
      rhs = pSVar6;
    }
    if (0x40 < uVar4) {
      rhs = pSVar6;
      lhs = pSVar5;
    }
    uVar9 = (ulong)(uVar8 << 3);
    uVar10 = 0;
    do {
      bVar12 = uVar8 == uVar10;
      if (bVar12) {
        return bVar12;
      }
      uVar11 = 0xffffffffffffffff;
      if (bVar7 != false) {
        uVar11 = ~*(ulong *)((long)&(pSVar5->super_SVIntStorage).field_0 + uVar10 * 8 + uVar9);
      }
      if ((bVar3 & 1U) != 0) {
        uVar11 = uVar11 & ~*(ulong *)((long)&(pSVar6->super_SVIntStorage).field_0 +
                                     uVar10 * 8 + uVar9);
      }
      paVar1 = &(rhs->super_SVIntStorage).field_0 + uVar10;
      paVar2 = &(lhs->super_SVIntStorage).field_0 + uVar10;
      uVar10 = uVar10 + 1;
    } while (((paVar1->val ^ paVar2->val) & uVar11) == 0);
  }
  else {
    if (uVar4 < uVar8) {
      SVInt::extend(&local_30,(bitwidth_t)lhs,SUB41(uVar8,0));
      bVar12 = caseXWildcardEqual(&local_30,rhs);
    }
    else {
      SVInt::extend(&local_30,(bitwidth_t)rhs,SUB41(uVar4,0));
      bVar12 = caseXWildcardEqual(lhs,&local_30);
    }
    SVInt::~SVInt(&local_30);
  }
  return bVar12;
}

Assistant:

bool caseXWildcardEqual(const SVInt& lhs, const SVInt& rhs) {
    // if no unknown flags, do normal comparison
    if (!lhs.unknownFlag && !rhs.unknownFlag)
        return exactlyEqual(lhs, rhs);

    // handle sign extension if necessary
    if (lhs.bitWidth != rhs.bitWidth) {
        bool bothSigned = lhs.signFlag && rhs.signFlag;
        if (lhs.bitWidth < rhs.bitWidth)
            return caseXWildcardEqual(lhs.extend(rhs.bitWidth, bothSigned), rhs);
        else
            return caseXWildcardEqual(lhs, rhs.extend(lhs.bitWidth, bothSigned));
    }

    uint32_t words = SVInt::getNumWords(rhs.bitWidth, false);
    for (uint32_t i = 0; i < words; ++i) {
        // bitmask to avoid comparing the unknown bits on either side
        uint64_t mask = UINT64_MAX;
        if (lhs.unknownFlag)
            mask &= ~lhs.pVal[i + words];
        if (rhs.unknownFlag)
            mask &= ~rhs.pVal[i + words];

        if ((lhs.getRawData()[i] & mask) != (rhs.getRawData()[i] & mask))
            return false;
    }

    return true;
}